

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O3

int Gia_ManDumpUntests(Gia_Man_t *pM,Cnf_Dat_t *pCnf,sat_solver *pSat,int nFuncVars,char *pFileName,
                      int fVerbose)

{
  int iVar1;
  int iVar2;
  FILE *__stream;
  Vec_Int_t *p;
  int *begin;
  ulong uVar3;
  Vec_Int_t *pVVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  
  __stream = fopen(pFileName,"wb");
  iVar1 = pM->vCis->nSize;
  iVar6 = pM->nRegs + nFuncVars;
  p = (Vec_Int_t *)malloc(0x10);
  iVar2 = 0x10;
  if (0xe < (iVar1 - iVar6) - 1U) {
    iVar2 = iVar1 - iVar6;
  }
  p->nSize = 0;
  p->nCap = iVar2;
  if (iVar2 == 0) {
    begin = (int *)0x0;
  }
  else {
    begin = (int *)malloc((long)iVar2 << 2);
  }
  p->pArray = begin;
  uVar5 = 0;
LAB_0053c2e1:
  iVar1 = sat_solver_solve(pSat,(lit *)0x0,(lit *)0x0,0,0,0,0);
  if (iVar1 == 0) {
    printf("Timeout reached after dumping %d untestable faults.\n",(ulong)uVar5);
  }
  else if (1 < iVar1 + 1U) {
    p->nSize = 0;
    iVar1 = pM->nRegs;
    pVVar4 = pM->vCis;
    iVar2 = pVVar4->nSize;
    uVar7 = 0;
    if (iVar1 < iVar2) {
      lVar8 = 0;
      do {
        if (iVar2 <= lVar8) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar2 = pVVar4->pArray[lVar8];
        if (((long)iVar2 < 0) || (pM->nObjs <= iVar2)) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (pM->pObjs == (Gia_Obj_t *)0x0) break;
        if (nFuncVars <= lVar8) {
          iVar1 = pCnf->pVarNums[iVar2];
          iVar2 = sat_solver_var_value(pSat,iVar1);
          if (iVar1 < 0) {
            __assert_fail("Var >= 0 && !(c >> 1)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                          ,0xf1,"int Abc_Var2Lit(int, int)");
          }
          Vec_IntPush(p,iVar2 + iVar1 * 2);
          iVar1 = pM->nRegs;
          pVVar4 = pM->vCis;
        }
        lVar8 = lVar8 + 1;
        iVar2 = pVVar4->nSize;
      } while (lVar8 < iVar2 - iVar1);
      uVar7 = p->nSize;
      uVar9 = (ulong)uVar7;
      begin = p->pArray;
      if (0 < (int)uVar7) {
        uVar3 = 0;
        do {
          if (begin[uVar3] < 0) goto LAB_0053c504;
          if ((begin[uVar3] & 1U) != 0) {
            if (fVerbose == 0) goto LAB_0053c433;
            printf("Untestable fault %4d : ");
            uVar3 = 0;
            goto LAB_0053c400;
          }
          uVar3 = uVar3 + 1;
        } while (uVar9 != uVar3);
      }
    }
    goto LAB_0053c478;
  }
  goto LAB_0053c4b5;
  while( true ) {
    if ((begin[uVar3] & 1U) != 0) {
      printf("%d ",uVar3 & 0xffffffff);
    }
    uVar3 = uVar3 + 1;
    if (uVar9 == uVar3) break;
LAB_0053c400:
    if (begin[uVar3] < 0) goto LAB_0053c504;
  }
  putchar(10);
LAB_0053c433:
  uVar3 = 0;
  do {
    if (begin[uVar3] < 0) {
LAB_0053c504:
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                    ,0xf3,"int Abc_LitIsCompl(int)");
    }
    if ((begin[uVar3] & 1U) != 0) {
      fprintf(__stream,"%d ",uVar3 & 0xffffffff);
    }
    uVar3 = uVar3 + 1;
  } while (uVar9 != uVar3);
  fputc(10,__stream);
LAB_0053c478:
  iVar1 = sat_solver_addclause(pSat,begin,begin + (int)uVar7);
  if (iVar1 == 0) goto LAB_0053c4b5;
  uVar5 = uVar5 + 1;
  if (uVar5 == 10000) {
    uVar5 = 10000;
LAB_0053c4b5:
    if (begin != (int *)0x0) {
      free(begin);
    }
    free(p);
    fclose(__stream);
    return uVar5;
  }
  goto LAB_0053c2e1;
}

Assistant:

int Gia_ManDumpUntests( Gia_Man_t * pM, Cnf_Dat_t * pCnf, sat_solver * pSat, int nFuncVars, char * pFileName, int fVerbose )
{
    FILE * pFile = fopen( pFileName, "wb" );
    Vec_Int_t * vLits;
    Gia_Obj_t * pObj;
    int nItersMax = 10000;
    int i, nIters, status, Value, Count = 0;
    vLits = Vec_IntAlloc( Gia_ManPiNum(pM) - nFuncVars );
    for ( nIters = 0; nIters < nItersMax; nIters++ )
    {
        status = sat_solver_solve( pSat, NULL, NULL, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
        if ( status == l_Undef )
            printf( "Timeout reached after dumping %d untestable faults.\n", nIters );
        if ( status == l_Undef )
            break;
        if ( status == l_False )
            break;
        // collect literals
        Vec_IntClear( vLits );
        Gia_ManForEachPi( pM, pObj, i )
            if ( i >= nFuncVars )
                Vec_IntPush( vLits, Abc_Var2Lit(pCnf->pVarNums[Gia_ObjId(pM, pObj)], sat_solver_var_value(pSat, pCnf->pVarNums[Gia_ObjId(pM, pObj)])) );
        // dump the fault
        Vec_IntForEachEntry( vLits, Value, i )
            if ( Abc_LitIsCompl(Value) )
                break;
        if ( i < Vec_IntSize(vLits) )
        {
            if ( fVerbose )
            {
                printf( "Untestable fault %4d : ", ++Count );
                Vec_IntForEachEntry( vLits, Value, i )
                    if ( Abc_LitIsCompl(Value) )
                        printf( "%d ", i );
                printf( "\n" );
            }
            Vec_IntForEachEntry( vLits, Value, i )
                if ( Abc_LitIsCompl(Value) )
                    fprintf( pFile, "%d ", i );
            fprintf( pFile, "\n" );
        }
        // add this clause
        if ( !sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits) ) )
            break;
    }
    Vec_IntFree( vLits );
    fclose( pFile );
    return nIters;
}